

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

void vline_tilde_float(t_vline *x,t_float f)

{
  double dVar1;
  _vseg *p_Var2;
  t_vseg *ptVar3;
  t_vseg **pptVar4;
  t_vseg *ptVar5;
  t_vseg *fatso;
  double dVar6;
  float fVar7;
  float fVar8;
  t_bigorsmall32 pun;
  
  dVar6 = clock_gettimesince(x->x_referencetime);
  fVar8 = 0.0;
  if ((((uint)f >> 0x1d ^ (uint)f >> 0x1e) & 1) != 0) {
    fVar8 = f;
  }
  if (x->x_inlet2 < 0.0) {
    x->x_value = (double)fVar8;
    vline_tilde_stop(x);
    return;
  }
  fVar7 = 0.0;
  if (0.0 <= x->x_inlet1) {
    fVar7 = x->x_inlet1;
  }
  dVar6 = dVar6 + (double)x->x_inlet2;
  ptVar3 = (t_vseg *)getbytes(0x20);
  pptVar4 = &x->x_list;
  fatso = x->x_list;
  if (fatso != (t_vseg *)0x0) {
    dVar1 = fatso->s_starttime;
    if ((dVar1 <= dVar6) &&
       (((dVar1 != dVar6 || (NAN(dVar1) || NAN(dVar6))) ||
        ((0.0 < fVar7 && (fatso->s_targettime <= dVar1)))))) {
      do {
        ptVar5 = fatso;
        fatso = ptVar5->s_next;
        if (fatso == (t_vseg *)0x0) {
          pptVar4 = &ptVar5->s_next;
          fatso = (t_vseg *)0x0;
          goto LAB_0011946a;
        }
        dVar1 = fatso->s_starttime;
      } while ((dVar1 <= dVar6) &&
              (((dVar1 != dVar6 || (NAN(dVar1) || NAN(dVar6))) ||
               ((0.0 < fVar7 && (fatso->s_targettime <= dVar1))))));
      pptVar4 = &ptVar5->s_next;
    }
  }
LAB_0011946a:
  *pptVar4 = ptVar3;
  while (fatso != (t_vseg *)0x0) {
    p_Var2 = fatso->s_next;
    freebytes(fatso,0x20);
    fatso = p_Var2;
  }
  ptVar3->s_next = (_vseg *)0x0;
  ptVar3->s_target = fVar8;
  ptVar3->s_starttime = dVar6;
  ptVar3->s_targettime = (double)fVar7 + dVar6;
  x->x_inlet1 = 0.0;
  x->x_inlet2 = 0.0;
  return;
}

Assistant:

static void vline_tilde_float(t_vline *x, t_float f)
{
    double timenow = clock_gettimesince(x->x_referencetime);
    t_float inlet1 = (x->x_inlet1 < 0 ? 0 : x->x_inlet1);
    t_float inlet2 = x->x_inlet2;
    double starttime = timenow + inlet2;
    t_vseg *s1, *s2, *deletefrom = 0, *snew;
    if (PD_BIGORSMALL(f))
        f = 0;

        /* negative delay input means stop and jump immediately to new value */
    if (inlet2 < 0)
    {
        x->x_value = f;
        vline_tilde_stop(x);
        return;
    }
    snew = (t_vseg *)t_getbytes(sizeof(*snew));
        /* check if we supplant the first item in the list.  We supplant
        an item by having an earlier starttime, or an equal starttime unless
        the equal one was instantaneous and the new one isn't (in which case
        we'll do a jump-and-slide starting at that time.) */
    if (!x->x_list || x->x_list->s_starttime > starttime ||
        (x->x_list->s_starttime == starttime &&
            (x->x_list->s_targettime > x->x_list->s_starttime || inlet1 <= 0)))
    {
        deletefrom = x->x_list;
        x->x_list = snew;
    }
    else
    {
        for (s1 = x->x_list; (s2 = s1->s_next); s1 = s2)
        {
            if (s2->s_starttime > starttime ||
                (s2->s_starttime == starttime &&
                    (s2->s_targettime > s2->s_starttime || inlet1 <= 0)))
            {
                deletefrom = s2;
                s1->s_next = snew;
                goto didit;
            }
        }
        s1->s_next = snew;
        deletefrom = 0;
    didit: ;
    }
    while (deletefrom)
    {
        s1 = deletefrom->s_next;
        t_freebytes(deletefrom, sizeof(*deletefrom));
        deletefrom = s1;
    }
    snew->s_next = 0;
    snew->s_target = f;
    snew->s_starttime = starttime;
    snew->s_targettime = starttime + inlet1;
    x->x_inlet1 = x->x_inlet2 = 0;
}